

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O2

void initAliasData(UErrorCode *errCode)

{
  uint uVar1;
  UDataMemory *pData;
  uint *puVar2;
  uint uVar3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  ucln_common_registerCleanup_63(UCLN_COMMON_UCNV_IO,ucnv_io_cleanup);
  pData = udata_openChoice_63((char *)0x0,"icu","cnvalias",isAcceptable,(void *)0x0,errCode);
  if (U_ZERO_ERROR < *errCode) {
    return;
  }
  puVar2 = (uint *)udata_getMemory_63(pData);
  uVar1 = *puVar2;
  if (uVar1 < 8) {
    *errCode = U_INVALID_FORMAT_ERROR;
    udata_close_63(pData);
    return;
  }
  gMainTable.optionTableSize = puVar2[7];
  if (uVar1 != 8) {
    gMainTable.normalizedStringTableSize = puVar2[9];
  }
  uVar9 = puVar2[1] + uVar1 * 2 + 2;
  uVar8 = puVar2[2] + uVar9;
  uVar7 = puVar2[3] + uVar8;
  uVar6 = puVar2[4] + uVar7;
  uVar5 = puVar2[5] + uVar6;
  uVar3 = puVar2[6] + uVar5;
  if (gMainTable.optionTableSize != 0) {
    uVar4 = *(ushort *)((long)puVar2 + (ulong)uVar3 * 2);
    if (uVar4 < 2) {
      gMainTable.optionTable = (UConverterAliasOptions *)((long)puVar2 + (ulong)uVar3 * 2);
      goto LAB_002a371b;
    }
  }
  gMainTable.optionTable = &defaultTableOptions;
  uVar4 = 0;
LAB_002a371b:
  gMainTable.stringTable =
       (uint16_t *)((long)puVar2 + (ulong)(gMainTable.optionTableSize + uVar3) * 2);
  gMainTable.normalizedStringTable =
       (uint16_t *)((long)puVar2 + (ulong)(puVar2[8] + gMainTable.optionTableSize + uVar3) * 2);
  if (uVar4 == 0) {
    gMainTable.normalizedStringTable = gMainTable.stringTable;
  }
  gMainTable.converterList = (uint16_t *)((long)puVar2 + (ulong)(uVar1 * 2 + 2) * 2);
  gMainTable.tagList = (uint16_t *)((long)puVar2 + (ulong)uVar9 * 2);
  gMainTable.aliasList = (uint16_t *)((long)puVar2 + (ulong)uVar8 * 2);
  gMainTable.untaggedConvArray = (uint16_t *)((long)puVar2 + (ulong)uVar7 * 2);
  gMainTable.taggedAliasArray = (uint16_t *)((long)puVar2 + (ulong)uVar6 * 2);
  gMainTable.taggedAliasLists = (uint16_t *)((long)puVar2 + (ulong)uVar5 * 2);
  gMainTable.converterListSize = puVar2[1];
  gMainTable.tagListSize = puVar2[2];
  gMainTable.aliasListSize = puVar2[3];
  gMainTable.untaggedConvArraySize = puVar2[4];
  gMainTable.taggedAliasArraySize = puVar2[5];
  gMainTable.taggedAliasListsSize = puVar2[6];
  gMainTable.stringTableSize = puVar2[8];
  gAliasData = pData;
  return;
}

Assistant:

static void U_CALLCONV initAliasData(UErrorCode &errCode) {
    UDataMemory *data;
    const uint16_t *table;
    const uint32_t *sectionSizes;
    uint32_t tableStart;
    uint32_t currOffset;

    ucln_common_registerCleanup(UCLN_COMMON_UCNV_IO, ucnv_io_cleanup);

    U_ASSERT(gAliasData == NULL);
    data = udata_openChoice(NULL, DATA_TYPE, DATA_NAME, isAcceptable, NULL, &errCode);
    if(U_FAILURE(errCode)) {
        return;
    }

    sectionSizes = (const uint32_t *)udata_getMemory(data);
    table = (const uint16_t *)sectionSizes;

    tableStart      = sectionSizes[0];
    if (tableStart < minTocLength) {
        errCode = U_INVALID_FORMAT_ERROR;
        udata_close(data);
        return;
    }
    gAliasData = data;

    gMainTable.converterListSize      = sectionSizes[1];
    gMainTable.tagListSize            = sectionSizes[2];
    gMainTable.aliasListSize          = sectionSizes[3];
    gMainTable.untaggedConvArraySize  = sectionSizes[4];
    gMainTable.taggedAliasArraySize   = sectionSizes[5];
    gMainTable.taggedAliasListsSize   = sectionSizes[6];
    gMainTable.optionTableSize        = sectionSizes[7];
    gMainTable.stringTableSize        = sectionSizes[8];

    if (tableStart > 8) {
        gMainTable.normalizedStringTableSize = sectionSizes[9];
    }

    currOffset = tableStart * (sizeof(uint32_t)/sizeof(uint16_t)) + (sizeof(uint32_t)/sizeof(uint16_t));
    gMainTable.converterList = table + currOffset;

    currOffset += gMainTable.converterListSize;
    gMainTable.tagList = table + currOffset;

    currOffset += gMainTable.tagListSize;
    gMainTable.aliasList = table + currOffset;

    currOffset += gMainTable.aliasListSize;
    gMainTable.untaggedConvArray = table + currOffset;

    currOffset += gMainTable.untaggedConvArraySize;
    gMainTable.taggedAliasArray = table + currOffset;

    /* aliasLists is a 1's based array, but it has a padding character */
    currOffset += gMainTable.taggedAliasArraySize;
    gMainTable.taggedAliasLists = table + currOffset;

    currOffset += gMainTable.taggedAliasListsSize;
    if (gMainTable.optionTableSize > 0
        && ((const UConverterAliasOptions *)(table + currOffset))->stringNormalizationType < UCNV_IO_NORM_TYPE_COUNT)
    {
        /* Faster table */
        gMainTable.optionTable = (const UConverterAliasOptions *)(table + currOffset);
    }
    else {
        /* Smaller table, or I can't handle this normalization mode!
        Use the original slower table lookup. */
        gMainTable.optionTable = &defaultTableOptions;
    }

    currOffset += gMainTable.optionTableSize;
    gMainTable.stringTable = table + currOffset;

    currOffset += gMainTable.stringTableSize;
    gMainTable.normalizedStringTable = ((gMainTable.optionTable->stringNormalizationType == UCNV_IO_UNNORMALIZED)
        ? gMainTable.stringTable : (table + currOffset));
}